

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O2

int arkRootfind(void *arkode_mem)

{
  undefined8 *puVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  sunrealtype t;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  if (arkode_mem == (void *)0x0) {
    iVar4 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,0x2fb,"arkRootfind",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                    ,"arkode_mem = NULL illegal.");
  }
  else {
    puVar1 = *(undefined8 **)((long)arkode_mem + 0x3d8);
    uVar5 = *(uint *)(puVar1 + 1);
    uVar11 = 0;
    uVar7 = 0;
    if (0 < (int)uVar5) {
      uVar7 = (ulong)uVar5;
    }
    dVar13 = 0.0;
    uVar10 = 0;
    bVar3 = false;
    bVar12 = false;
    for (; uVar7 != uVar11; uVar11 = uVar11 + 1) {
      if (*(int *)(puVar1[0xe] + uVar11 * 4) != 0) {
        dVar14 = *(double *)(puVar1[8] + uVar11 * 8);
        if ((dVar14 != 0.0) || (NAN(dVar14))) {
          dVar18 = *(double *)(puVar1[7] + uVar11 * 8);
          if (((((0.0 < dVar14) && (dVar18 < 0.0)) || ((dVar14 < 0.0 && (0.0 < dVar18)))) &&
              ((double)*(int *)(puVar1[3] + uVar11 * 4) * dVar18 <= 0.0)) &&
             (dVar14 = ABS(dVar14 / (dVar14 - dVar18)), dVar13 < dVar14)) {
            uVar10 = uVar11 & 0xffffffff;
            bVar12 = true;
            dVar13 = dVar14;
          }
        }
        else if ((double)*(int *)(puVar1[3] + uVar11 * 4) * *(double *)(puVar1[7] + uVar11 * 8) <=
                 0.0) {
          bVar3 = true;
        }
      }
    }
    if (bVar12) {
      dVar13 = (double)puVar1[4];
      dVar18 = (double)puVar1[5];
      dVar14 = (double)puVar1[0xb];
      dVar17 = 1.0;
      dVar16 = 0.5;
      iVar4 = 0;
      iVar6 = -1;
      do {
        iVar9 = iVar4;
        dVar15 = dVar18 - dVar13;
        if (ABS(dVar15) <= dVar14) goto LAB_00157056;
        if (iVar6 == iVar9) {
          dVar17 = dVar17 * dVar16;
        }
        else {
          dVar17 = 1.0;
        }
        dVar16 = *(double *)(puVar1[8] + (long)(int)uVar10 * 8);
        t = dVar18 - (dVar15 * dVar16) /
                     (dVar16 - *(double *)(puVar1[7] + (long)(int)uVar10 * 8) * dVar17);
        dVar16 = ABS(dVar15) / dVar14;
        if (ABS(t - dVar13) < dVar14 * 0.5) {
          t = (double)(-(ulong)(5.0 < dVar16) & 0x3fb999999999999a |
                      ~-(ulong)(5.0 < dVar16) & (ulong)(0.5 / dVar16)) * dVar15 + dVar13;
        }
        if (ABS(dVar18 - t) < dVar14 * 0.5) {
          t = (double)(-(ulong)(5.0 < dVar16) & 0xbfb999999999999a |
                      ~-(ulong)(5.0 < dVar16) & (ulong)(-0.5 / dVar16)) * dVar15 + dVar18;
        }
        ARKodeGetDky(arkode_mem,t,0,*(N_Vector *)((long)arkode_mem + 0x248));
        iVar4 = (*(code *)*puVar1)(t,*(undefined8 *)((long)arkode_mem + 0x248),puVar1[9],
                                   puVar1[0x10]);
        puVar1[0xd] = puVar1[0xd] + 1;
        if (iVar4 != 0) {
          return -0xc;
        }
        uVar5 = *(uint *)(puVar1 + 1);
        uVar11 = 0;
        uVar7 = 0;
        if (0 < (int)uVar5) {
          uVar7 = (ulong)uVar5;
        }
        dVar13 = 0.0;
        bVar3 = false;
        bVar12 = false;
        for (; iVar4 = 1, uVar7 != uVar11; uVar11 = uVar11 + 1) {
          if (*(int *)(puVar1[0xe] + uVar11 * 4) != 0) {
            dVar14 = *(double *)(puVar1[9] + uVar11 * 8);
            if ((dVar14 != 0.0) || (NAN(dVar14))) {
              dVar18 = *(double *)(puVar1[7] + uVar11 * 8);
              if ((((0.0 < dVar14) && (dVar18 < 0.0)) || ((dVar14 < 0.0 && (0.0 < dVar18)))) &&
                 (((double)*(int *)(puVar1[3] + uVar11 * 4) * dVar18 <= 0.0 &&
                  (dVar14 = ABS(dVar14 / (dVar14 - dVar18)), dVar13 < dVar14)))) {
                uVar10 = uVar11 & 0xffffffff;
                bVar12 = true;
                dVar13 = dVar14;
              }
            }
            else if ((double)*(int *)(puVar1[3] + uVar11 * 4) * *(double *)(puVar1[7] + uVar11 * 8)
                     <= 0.0) {
              bVar3 = true;
            }
          }
        }
        if (bVar12) {
          puVar1[5] = t;
          for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
            *(undefined8 *)(puVar1[8] + uVar11 * 8) = *(undefined8 *)(puVar1[9] + uVar11 * 8);
          }
          dVar13 = (double)puVar1[4];
          dVar18 = (double)puVar1[5];
          dVar14 = (double)puVar1[0xb];
          bVar12 = dVar14 < ABS(dVar18 - dVar13);
          dVar16 = 0.5;
        }
        else {
          if (bVar3) {
            puVar1[5] = t;
            uVar7 = 0;
            uVar11 = 0;
            if (0 < (int)uVar5) {
              uVar11 = (ulong)uVar5;
            }
            for (; uVar11 != uVar7; uVar7 = uVar7 + 1) {
              *(undefined8 *)(puVar1[8] + uVar7 * 8) = *(undefined8 *)(puVar1[9] + uVar7 * 8);
            }
            dVar18 = (double)puVar1[5];
LAB_00157056:
            puVar1[6] = dVar18;
            for (lVar8 = 0; lVar8 < (int)uVar5; lVar8 = lVar8 + 1) {
              dVar13 = *(double *)(puVar1[8] + lVar8 * 8);
              *(double *)(puVar1[9] + lVar8 * 8) = dVar13;
              lVar2 = puVar1[2];
              *(undefined4 *)(lVar2 + lVar8 * 4) = 0;
              if (*(int *)(puVar1[0xe] + lVar8 * 4) != 0) {
                if ((dVar13 != 0.0) || (NAN(dVar13))) {
                  dVar14 = *(double *)(puVar1[7] + lVar8 * 8);
                }
                else {
                  dVar14 = *(double *)(puVar1[7] + lVar8 * 8);
                  if ((double)*(int *)(puVar1[3] + lVar8 * 4) * dVar14 <= 0.0) {
                    *(uint *)(lVar2 + lVar8 * 4) = (uint)(dVar14 <= 0.0) * 2 + -1;
                  }
                }
                if ((((0.0 < dVar13) && (dVar14 < 0.0)) || ((dVar13 < 0.0 && (0.0 < dVar14)))) &&
                   ((double)*(int *)(puVar1[3] + lVar8 * 4) * dVar14 <= 0.0)) {
                  *(uint *)(lVar2 + lVar8 * 4) = (uint)(dVar14 <= 0.0) * 2 + -1;
                }
              }
              uVar5 = *(uint *)(puVar1 + 1);
            }
            return 1;
          }
          puVar1[4] = t;
          for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
            *(undefined8 *)(puVar1[7] + uVar11 * 8) = *(undefined8 *)(puVar1[9] + uVar11 * 8);
          }
          dVar13 = (double)puVar1[4];
          dVar18 = (double)puVar1[5];
          dVar14 = (double)puVar1[0xb];
          bVar12 = dVar14 < ABS(dVar18 - dVar13);
          dVar16 = 2.0;
          iVar4 = 2;
        }
        iVar6 = iVar9;
        if (!bVar12) goto LAB_00157056;
      } while( true );
    }
    puVar1[6] = puVar1[5];
    for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
      *(undefined8 *)(puVar1[9] + uVar11 * 8) = *(undefined8 *)(puVar1[8] + uVar11 * 8);
    }
    if (bVar3) {
      iVar4 = 1;
      for (lVar8 = 0; lVar8 < (int)uVar5; lVar8 = lVar8 + 1) {
        lVar2 = puVar1[2];
        *(undefined4 *)(lVar2 + lVar8 * 4) = 0;
        if (((*(int *)(puVar1[0xe] + lVar8 * 4) != 0) &&
            (dVar13 = *(double *)(puVar1[8] + lVar8 * 8), dVar13 == 0.0)) && (!NAN(dVar13))) {
          *(uint *)(lVar2 + lVar8 * 4) = (uint)(*(double *)(puVar1[7] + lVar8 * 8) <= 0.0) * 2 + -1;
        }
        uVar5 = *(uint *)(puVar1 + 1);
      }
    }
    else {
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int arkRootfind(void* arkode_mem)
{
  sunrealtype alpha, tmid, gfrac, maxfrac, fracint, fracsub;
  int i, retval, imax, side, sideprev;
  sunbooleantype zroot, sgnchg;
  ARKodeMem ark_mem;
  ARKodeRootMem rootmem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;
  rootmem = ark_mem->root_mem;

  imax = 0;

  /* First check for change in sign in ghi or for a zero in ghi. */
  maxfrac = ZERO;
  zroot   = SUNFALSE;
  sgnchg  = SUNFALSE;
  for (i = 0; i < rootmem->nrtfn; i++)
  {
    if (!rootmem->gactive[i]) { continue; }
    if (SUNRabs(rootmem->ghi[i]) == ZERO)
    {
      if (rootmem->rootdir[i] * rootmem->glo[i] <= ZERO) { zroot = SUNTRUE; }
    }
    else
    {
      if ((DIFFERENT_SIGN(rootmem->glo[i], rootmem->ghi[i])) &&
          (rootmem->rootdir[i] * rootmem->glo[i] <= ZERO))
      {
        gfrac = SUNRabs(rootmem->ghi[i] / (rootmem->ghi[i] - rootmem->glo[i]));
        if (gfrac > maxfrac)
        {
          sgnchg  = SUNTRUE;
          maxfrac = gfrac;
          imax    = i;
        }
      }
    }
  }

  /* If no sign change was found, reset trout and grout.  Then return
     ARK_SUCCESS if no zero was found, or set iroots and return RTFOUND.  */
  if (!sgnchg)
  {
    rootmem->trout = rootmem->thi;
    for (i = 0; i < rootmem->nrtfn; i++)
    {
      rootmem->grout[i] = rootmem->ghi[i];
    }
    if (!zroot) { return (ARK_SUCCESS); }
    for (i = 0; i < rootmem->nrtfn; i++)
    {
      rootmem->iroots[i] = 0;
      if (!rootmem->gactive[i]) { continue; }
      if (SUNRabs(rootmem->ghi[i]) == ZERO)
      {
        rootmem->iroots[i] = rootmem->glo[i] > 0 ? -1 : 1;
      }
    }
    return (RTFOUND);
  }

  /* Initialize alpha to avoid compiler warning */
  alpha = ONE;

  /* A sign change was found.  Loop to locate nearest root. */
  side     = 0;
  sideprev = -1;
  for (;;)
  { /* Looping point */

    /* If interval size is already less than tolerance ttol, break. */
    if (SUNRabs(rootmem->thi - rootmem->tlo) <= rootmem->ttol) { break; }

    /* Set weight alpha.
       On the first two passes, set alpha = 1.  Thereafter, reset alpha
       according to the side (low vs high) of the subinterval in which
       the sign change was found in the previous two passes.
       If the sides were opposite, set alpha = 1.
       If the sides were the same, then double alpha (if high side),
       or halve alpha (if low side).
       The next guess tmid is the secant method value if alpha = 1, but
       is closer to tlo if alpha < 1, and closer to thi if alpha > 1.    */
    if (sideprev == side) { alpha = (side == 2) ? alpha * TWO : alpha * HALF; }
    else { alpha = ONE; }

    /* Set next root approximation tmid and get g(tmid).
       If tmid is too close to tlo or thi, adjust it inward,
       by a fractional distance that is between 0.1 and 0.5.  */
    tmid = rootmem->thi - (rootmem->thi - rootmem->tlo) * rootmem->ghi[imax] /
                            (rootmem->ghi[imax] - alpha * rootmem->glo[imax]);
    if (SUNRabs(tmid - rootmem->tlo) < HALF * rootmem->ttol)
    {
      fracint = SUNRabs(rootmem->thi - rootmem->tlo) / rootmem->ttol;
      fracsub = (fracint > FIVE) ? TENTH : HALF / fracint;
      tmid    = rootmem->tlo + fracsub * (rootmem->thi - rootmem->tlo);
    }
    if (SUNRabs(rootmem->thi - tmid) < HALF * rootmem->ttol)
    {
      fracint = SUNRabs(rootmem->thi - rootmem->tlo) / rootmem->ttol;
      fracsub = (fracint > FIVE) ? TENTH : HALF / fracint;
      tmid    = rootmem->thi - fracsub * (rootmem->thi - rootmem->tlo);
    }

    (void)ARKodeGetDky(ark_mem, tmid, 0, ark_mem->ycur);
    retval = rootmem->gfun(tmid, ark_mem->ycur, rootmem->grout,
                           rootmem->root_data);
    rootmem->nge++;
    if (retval != 0) { return (ARK_RTFUNC_FAIL); }

    /* Check to see in which subinterval g changes sign, and reset imax.
       Set side = 1 if sign change is on low side, or 2 if on high side.  */
    maxfrac  = ZERO;
    zroot    = SUNFALSE;
    sgnchg   = SUNFALSE;
    sideprev = side;
    for (i = 0; i < rootmem->nrtfn; i++)
    {
      if (!rootmem->gactive[i]) { continue; }
      if (SUNRabs(rootmem->grout[i]) == ZERO)
      {
        if (rootmem->rootdir[i] * rootmem->glo[i] <= ZERO) { zroot = SUNTRUE; }
      }
      else
      {
        if ((DIFFERENT_SIGN(rootmem->glo[i], rootmem->grout[i])) &&
            (rootmem->rootdir[i] * rootmem->glo[i] <= ZERO))
        {
          gfrac =
            SUNRabs(rootmem->grout[i] / (rootmem->grout[i] - rootmem->glo[i]));
          if (gfrac > maxfrac)
          {
            sgnchg  = SUNTRUE;
            maxfrac = gfrac;
            imax    = i;
          }
        }
      }
    }
    if (sgnchg)
    {
      /* Sign change found in (tlo,tmid); replace thi with tmid. */
      rootmem->thi = tmid;
      for (i = 0; i < rootmem->nrtfn; i++)
      {
        rootmem->ghi[i] = rootmem->grout[i];
      }
      side = 1;
      /* Stop at root thi if converged; otherwise loop. */
      if (SUNRabs(rootmem->thi - rootmem->tlo) <= rootmem->ttol) { break; }
      continue; /* Return to looping point. */
    }

    if (zroot)
    {
      /* No sign change in (tlo,tmid), but g = 0 at tmid; return root tmid. */
      rootmem->thi = tmid;
      for (i = 0; i < rootmem->nrtfn; i++)
      {
        rootmem->ghi[i] = rootmem->grout[i];
      }
      break;
    }

    /* No sign change in (tlo,tmid), and no zero at tmid.
       Sign change must be in (tmid,thi).  Replace tlo with tmid. */
    rootmem->tlo = tmid;
    for (i = 0; i < rootmem->nrtfn; i++)
    {
      rootmem->glo[i] = rootmem->grout[i];
    }
    side = 2;
    /* Stop at root thi if converged; otherwise loop back. */
    if (SUNRabs(rootmem->thi - rootmem->tlo) <= rootmem->ttol) { break; }

  } /* End of root-search loop */

  /* Reset trout and grout, set iroots, and return RTFOUND. */
  rootmem->trout = rootmem->thi;
  for (i = 0; i < rootmem->nrtfn; i++)
  {
    rootmem->grout[i]  = rootmem->ghi[i];
    rootmem->iroots[i] = 0;
    if (!rootmem->gactive[i]) { continue; }
    if ((SUNRabs(rootmem->ghi[i]) == ZERO) &&
        (rootmem->rootdir[i] * rootmem->glo[i] <= ZERO))
    {
      rootmem->iroots[i] = rootmem->glo[i] > 0 ? -1 : 1;
    }
    if ((DIFFERENT_SIGN(rootmem->glo[i], rootmem->ghi[i])) &&
        (rootmem->rootdir[i] * rootmem->glo[i] <= ZERO))
    {
      rootmem->iroots[i] = rootmem->glo[i] > 0 ? -1 : 1;
    }
  }
  return (RTFOUND);
}